

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O2

void * set_new(t_symbol *why,int argc,t_atom *argv)

{
  int iVar1;
  t_object *owner;
  t_symbol *ptVar2;
  _outlet *p_Var3;
  void *pvVar4;
  uint argc_00;
  uint which;
  t_atom *argv_00;
  t_symbol **sp;
  t_atom at;
  
  owner = (t_object *)pd_new(set_class);
  if ((argc != 0) && (argv->a_type == A_SYMBOL)) {
    iVar1 = strcmp(((argv->a_w).w_symbol)->s_name,"-symbol");
    if (iVar1 == 0) {
      *(undefined4 *)((long)&owner[1].te_inlet + 4) = 1;
      argc = argc + -1;
      argv = argv + 1;
      goto LAB_0015e65a;
    }
  }
  *(undefined4 *)((long)&owner[1].te_inlet + 4) = 0;
LAB_0015e65a:
  ptVar2 = atom_getsymbolarg(0,argc,argv);
  p_Var3 = (_outlet *)template_getbindsym(ptVar2);
  owner[1].te_outlet = p_Var3;
  if (argc < 2) {
    argv_00 = &at;
    at.a_type = A_SYMBOL;
    at.a_w.w_symbol = &s_;
    argc_00 = 1;
  }
  else {
    argc_00 = argc - 1;
    argv_00 = argv + 1;
  }
  pvVar4 = getbytes((ulong)argc_00 << 4);
  *(void **)&owner[1].te_xpix = pvVar4;
  *(uint *)&owner[1].te_inlet = argc_00;
  sp = (t_symbol **)((long)pvVar4 + 8);
  for (which = 0; argc_00 != which; which = which + 1) {
    ptVar2 = atom_getsymbolarg(which,argc_00,argv_00);
    sp[-1] = ptVar2;
    if (*(int *)((long)&owner[1].te_inlet + 4) == 0) {
      *(undefined4 *)sp = 0;
    }
    else {
      *sp = &s_;
    }
    if (which != 0) {
      if (*(int *)((long)&owner[1].te_inlet + 4) == 0) {
        floatinlet_new(owner,(t_float *)sp);
      }
      else {
        symbolinlet_new(owner,sp);
      }
    }
    sp = sp + 2;
  }
  pointerinlet_new(owner,(t_gpointer *)(owner + 1));
  gpointer_init((t_gpointer *)(owner + 1));
  return owner;
}

Assistant:

static void *set_new(t_symbol *why, int argc, t_atom *argv)
{
    t_set *x = (t_set *)pd_new(set_class);
    int i, varcount;
    t_setvariable *sp;
    t_atom at, *varvec;
    if (argc && (argv[0].a_type == A_SYMBOL) &&
        !strcmp(argv[0].a_w.w_symbol->s_name, "-symbol"))
    {
        x->x_issymbol = 1;
        argc--;
        argv++;
    }
    else x->x_issymbol = 0;
    x->x_templatesym = template_getbindsym(atom_getsymbolarg(0, argc, argv));
    if (argc < 2)
    {
        varcount = 1;
        varvec = &at;
        SETSYMBOL(&at, &s_);
    }
    else varcount = argc - 1, varvec = argv + 1;
    x->x_variables
        = (t_setvariable *)getbytes(varcount * sizeof (*x->x_variables));
    x->x_nin = varcount;
    for (i = 0, sp = x->x_variables; i < varcount; i++, sp++)
    {
        sp->gv_sym = atom_getsymbolarg(i, varcount, varvec);
        if (x->x_issymbol)
            sp->gv_w.w_symbol = &s_;
        else sp->gv_w.w_float = 0;
        if (i)
        {
            if (x->x_issymbol)
                symbolinlet_new(&x->x_obj, &sp->gv_w.w_symbol);
            else floatinlet_new(&x->x_obj, &sp->gv_w.w_float);
        }
    }
    pointerinlet_new(&x->x_obj, &x->x_gp);
    gpointer_init(&x->x_gp);
    return (x);
}